

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_open_output_file_op(sexp ctx,sexp self,sexp_sint_t n,sexp path)

{
  FILE *__stream;
  int *piVar1;
  sexp psVar2;
  int iVar3;
  
  if ((((ulong)path & 3) != 0) || (path->tag != 9)) {
    psVar2 = sexp_type_exception(ctx,self,9,path);
    return psVar2;
  }
  iVar3 = 0;
  while( true ) {
    if (iVar3 != 0) {
      sexp_gc(ctx,(size_t *)0x0);
    }
    __stream = fopen((((path->value).type.cpl)->value).flonum_bits +
                     (long)(((path->value).type.name)->value).flonum_bits,"w");
    if (__stream != (FILE *)0x0) break;
    piVar1 = __errno_location();
    if ((*piVar1 != 0x18) || (iVar3 = iVar3 + 1, iVar3 != 1)) {
      psVar2 = sexp_file_exception(ctx,self,"couldn\'t open output file",path);
      return psVar2;
    }
  }
  iVar3 = fileno(__stream);
  fcntl(iVar3,4,0x800);
  psVar2 = sexp_make_output_port(ctx,(FILE *)__stream,path);
  return psVar2;
}

Assistant:

sexp sexp_open_output_file_op (sexp ctx, sexp self, sexp_sint_t n, sexp path) {
  FILE *out;
  int count = 0;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, path);
  do {
    if (count != 0) sexp_gc(ctx, NULL);
    out = fopen(sexp_string_data(path), "w");
  } while (!out && sexp_out_of_file_descriptors() && !count++);
  if (!out)
    return sexp_file_exception(ctx, self, "couldn't open output file", path);
#if SEXP_USE_GREEN_THREADS
  fcntl(fileno(out), F_SETFL, O_NONBLOCK);
#endif
  return sexp_make_output_port(ctx, out, path);
}